

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

void ma_dr_mp3d_DCT_II(float *grbuf,int n)

{
  int iVar1;
  long lVar2;
  int in_ESI;
  long in_RDI;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  ma_dr_mp3_f4 s_1;
  ma_dr_mp3_f4 s;
  ma_dr_mp3_f4 xt;
  ma_dr_mp3_f4 x7;
  ma_dr_mp3_f4 x6;
  ma_dr_mp3_f4 x5;
  ma_dr_mp3_f4 x4;
  ma_dr_mp3_f4 x3_1;
  ma_dr_mp3_f4 x2_1;
  ma_dr_mp3_f4 x1_1;
  ma_dr_mp3_f4 x0_1;
  ma_dr_mp3_f4 t3;
  ma_dr_mp3_f4 t2;
  ma_dr_mp3_f4 t1;
  ma_dr_mp3_f4 t0;
  ma_dr_mp3_f4 x3;
  ma_dr_mp3_f4 x2;
  ma_dr_mp3_f4 x1;
  ma_dr_mp3_f4 x0;
  float *y;
  ma_dr_mp3_f4 *x;
  ma_dr_mp3_f4 t [4] [8];
  int k;
  int i;
  undefined8 local_f28;
  undefined8 uStack_f20;
  undefined8 local_f18;
  undefined8 uStack_f10;
  undefined8 local_f08;
  undefined8 uStack_f00;
  undefined8 local_ef8;
  undefined8 uStack_ef0;
  undefined8 local_ee8;
  undefined8 uStack_ee0;
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  undefined8 *local_e28;
  float *local_e20;
  float local_e18 [2];
  undefined8 uStack_e10;
  undefined8 local_da8;
  undefined8 uStack_da0;
  float local_d98 [2];
  undefined8 uStack_d90;
  undefined8 auStack_d88 [14];
  float local_d18 [2];
  undefined8 uStack_d10;
  undefined8 auStack_d08 [14];
  float local_c98 [2];
  undefined8 uStack_c90;
  undefined8 auStack_c88 [15];
  int local_c0c;
  int local_c08;
  int local_c04;
  long local_c00;
  undefined4 local_bf8;
  undefined4 uStack_bf4;
  undefined4 uStack_bf0;
  undefined4 uStack_bec;
  undefined4 local_be8;
  undefined4 local_bd8;
  undefined4 uStack_bd4;
  undefined4 uStack_bd0;
  undefined4 uStack_bcc;
  undefined4 local_bbc;
  undefined4 local_bb8;
  undefined4 uStack_bb4;
  undefined4 uStack_bb0;
  undefined4 uStack_bac;
  undefined4 local_b9c;
  undefined4 local_b98;
  undefined4 uStack_b94;
  undefined4 uStack_b90;
  undefined4 uStack_b8c;
  undefined4 local_b7c;
  undefined4 local_b78;
  undefined4 uStack_b74;
  undefined4 uStack_b70;
  undefined4 uStack_b6c;
  undefined4 local_b5c;
  undefined4 local_b58;
  undefined4 uStack_b54;
  undefined4 uStack_b50;
  undefined4 uStack_b4c;
  undefined4 local_b3c;
  undefined4 local_b38;
  undefined4 uStack_b34;
  undefined4 uStack_b30;
  undefined4 uStack_b2c;
  undefined4 local_b1c;
  undefined4 local_b18;
  undefined4 uStack_b14;
  undefined4 uStack_b10;
  undefined4 uStack_b0c;
  undefined4 local_afc;
  undefined4 local_af8;
  undefined4 uStack_af4;
  undefined4 uStack_af0;
  undefined4 uStack_aec;
  undefined4 local_adc;
  undefined4 local_ad8;
  undefined4 uStack_ad4;
  undefined4 uStack_ad0;
  undefined4 uStack_acc;
  undefined4 local_abc;
  undefined4 local_ab8;
  undefined4 uStack_ab4;
  undefined4 uStack_ab0;
  undefined4 uStack_aac;
  undefined4 local_a9c;
  undefined4 local_a98;
  undefined4 uStack_a94;
  undefined4 uStack_a90;
  undefined4 uStack_a8c;
  undefined4 local_a7c;
  float local_a78;
  float fStack_a74;
  float fStack_a70;
  float fStack_a6c;
  float local_a68;
  float local_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float local_a3c;
  float local_a38;
  float fStack_a34;
  float fStack_a30;
  float fStack_a2c;
  float local_a1c;
  float local_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  float local_9fc;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  float local_9e8;
  float fStack_9e4;
  float fStack_9e0;
  float fStack_9dc;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  float local_9c8;
  float fStack_9c4;
  float fStack_9c0;
  float fStack_9bc;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  float local_9a8;
  float fStack_9a4;
  float fStack_9a0;
  float fStack_99c;
  undefined8 local_998;
  undefined8 uStack_990;
  float local_988;
  float fStack_984;
  float fStack_980;
  float fStack_97c;
  undefined8 local_978;
  undefined8 uStack_970;
  float local_968;
  float fStack_964;
  float fStack_960;
  float fStack_95c;
  undefined8 local_958;
  undefined8 uStack_950;
  float local_948;
  float fStack_944;
  float fStack_940;
  float fStack_93c;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  float local_8c8;
  float fStack_8c4;
  float fStack_8c0;
  float fStack_8bc;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  float local_8a8;
  float fStack_8a4;
  float fStack_8a0;
  float fStack_89c;
  undefined8 local_898;
  undefined8 uStack_890;
  float local_888;
  float fStack_884;
  float fStack_880;
  float fStack_87c;
  undefined8 local_878;
  undefined8 uStack_870;
  float local_868;
  float fStack_864;
  float fStack_860;
  float fStack_85c;
  undefined8 local_858;
  undefined8 uStack_850;
  float local_848;
  float fStack_844;
  float fStack_840;
  float fStack_83c;
  undefined8 local_838;
  undefined8 uStack_830;
  float local_828;
  float fStack_824;
  float fStack_820;
  float fStack_81c;
  undefined8 local_818;
  undefined8 uStack_810;
  float local_808;
  float fStack_804;
  float fStack_800;
  float fStack_7fc;
  undefined8 *local_7f8;
  undefined8 *local_7f0;
  undefined8 *local_7e8;
  undefined8 *local_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  float local_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 *local_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 *local_3e0;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  undefined8 *local_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 *local_3a0;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  undefined8 *local_380;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  undefined8 *local_360;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  undefined8 *local_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 *local_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  undefined8 local_288;
  undefined8 uStack_280;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 *local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 *local_c0;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined8 *local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 *local_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined8 *local_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined8 *local_40;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  undefined8 *local_20;
  undefined8 local_18;
  undefined8 uStack_10;
  undefined8 *local_8;
  
  local_c0c = 0;
  local_c04 = in_ESI;
  local_c00 = in_RDI;
  iVar1 = ma_dr_mp3_have_simd();
  if (iVar1 != 0) {
    for (; local_c0c < local_c04; local_c0c = local_c0c + 4) {
      local_e28 = (undefined8 *)(local_c00 + (long)local_c0c * 4);
      local_e20 = local_e18;
      for (local_c08 = 0; local_c08 < 8; local_c08 = local_c08 + 1) {
        local_7e0 = (undefined8 *)((long)local_e28 + (long)(local_c08 * 0x12) * 4);
        local_128 = *local_7e0;
        uStack_120 = local_7e0[1];
        local_7e8 = (undefined8 *)((long)local_e28 + (long)((0xf - local_c08) * 0x12) * 4);
        local_108 = *local_7e8;
        uStack_100 = local_7e8[1];
        local_7f0 = (undefined8 *)((long)local_e28 + (long)(local_c08 * 0x12 + 0x120) * 4);
        local_118 = *local_7f0;
        uStack_110 = local_7f0[1];
        local_7f8 = (undefined8 *)((long)local_e28 + (long)((0x1f - local_c08) * 0x12) * 4);
        local_138 = *local_7f8;
        uStack_130 = local_7f8[1];
        local_428 = local_128;
        uStack_420 = uStack_120;
        local_438 = local_138;
        uStack_430 = uStack_130;
        local_428._0_4_ = (float)local_128;
        local_428._4_4_ = (float)((ulong)local_128 >> 0x20);
        uStack_420._0_4_ = (float)uStack_120;
        uStack_420._4_4_ = (float)((ulong)uStack_120 >> 0x20);
        local_438._0_4_ = (float)local_138;
        local_438._4_4_ = (float)((ulong)local_138 >> 0x20);
        uStack_430._0_4_ = (float)uStack_130;
        uStack_430._4_4_ = (float)((ulong)uStack_130 >> 0x20);
        fVar3 = (float)local_428 + (float)local_438;
        fVar8 = local_428._4_4_ + local_438._4_4_;
        fVar12 = (float)uStack_420 + (float)uStack_430;
        fVar23 = uStack_420._4_4_ + uStack_430._4_4_;
        local_448 = local_108;
        uStack_440 = uStack_100;
        local_458 = local_118;
        uStack_450 = uStack_110;
        local_448._0_4_ = (float)local_108;
        local_448._4_4_ = (float)((ulong)local_108 >> 0x20);
        uStack_440._0_4_ = (float)uStack_100;
        uStack_440._4_4_ = (float)((ulong)uStack_100 >> 0x20);
        local_458._0_4_ = (float)local_118;
        local_458._4_4_ = (float)((ulong)local_118 >> 0x20);
        uStack_450._0_4_ = (float)uStack_110;
        uStack_450._4_4_ = (float)((ulong)uStack_110 >> 0x20);
        fVar4 = (float)local_448 + (float)local_458;
        fVar9 = local_448._4_4_ + local_458._4_4_;
        fVar13 = (float)uStack_440 + (float)uStack_450;
        fVar24 = uStack_440._4_4_ + uStack_450._4_4_;
        local_9fc = ma_dr_mp3d_DCT_II::g_sec[local_c08 * 3];
        local_a18 = local_9fc;
        fStack_a14 = local_9fc;
        fStack_a10 = local_9fc;
        fStack_a0c = local_9fc;
        local_808 = (float)local_448 - (float)local_458;
        fStack_804 = local_448._4_4_ - local_458._4_4_;
        fStack_800 = (float)uStack_440 - (float)uStack_450;
        fStack_7fc = uStack_440._4_4_ - uStack_450._4_4_;
        local_818 = CONCAT44(local_9fc,local_9fc);
        uStack_810 = CONCAT44(local_9fc,local_9fc);
        fVar5 = ((float)local_448 - (float)local_458) * local_9fc;
        fVar10 = (local_448._4_4_ - local_458._4_4_) * local_9fc;
        fVar14 = ((float)uStack_440 - (float)uStack_450) * local_9fc;
        fVar25 = (uStack_440._4_4_ - uStack_450._4_4_) * local_9fc;
        local_a1c = ma_dr_mp3d_DCT_II::g_sec[(long)(local_c08 * 3) + 1];
        local_a38 = local_a1c;
        fStack_a34 = local_a1c;
        fStack_a30 = local_a1c;
        fStack_a2c = local_a1c;
        local_828 = (float)local_428 - (float)local_438;
        fStack_824 = local_428._4_4_ - local_438._4_4_;
        fStack_820 = (float)uStack_420 - (float)uStack_430;
        fStack_81c = uStack_420._4_4_ - uStack_430._4_4_;
        local_838 = CONCAT44(local_a1c,local_a1c);
        uStack_830 = CONCAT44(local_a1c,local_a1c);
        fVar6 = ((float)local_428 - (float)local_438) * local_a1c;
        fVar11 = (local_428._4_4_ - local_438._4_4_) * local_a1c;
        fVar15 = ((float)uStack_420 - (float)uStack_430) * local_a1c;
        fVar26 = (uStack_420._4_4_ - uStack_430._4_4_) * local_a1c;
        local_468 = CONCAT44(fVar8,fVar3);
        uStack_460 = CONCAT44(fVar23,fVar12);
        local_478 = CONCAT44(fVar9,fVar4);
        uStack_470 = CONCAT44(fVar24,fVar13);
        *local_e20 = fVar3 + fVar4;
        local_e20[1] = fVar8 + fVar9;
        local_e20[2] = fVar12 + fVar13;
        local_e20[3] = fVar23 + fVar24;
        local_148 = CONCAT44(fVar8,fVar3);
        uStack_140 = CONCAT44(fVar23,fVar12);
        local_158 = CONCAT44(fVar9,fVar4);
        uStack_150 = CONCAT44(fVar24,fVar13);
        fVar7 = ma_dr_mp3d_DCT_II::g_sec[(long)(local_c08 * 3) + 2];
        local_a3c = fVar7;
        local_a58 = fVar7;
        fStack_a54 = fVar7;
        fStack_a50 = fVar7;
        fStack_a4c = fVar7;
        local_848 = fVar3 - fVar4;
        fStack_844 = fVar8 - fVar9;
        fStack_840 = fVar12 - fVar13;
        fStack_83c = fVar23 - fVar24;
        local_858 = CONCAT44(fVar7,fVar7);
        uStack_850 = CONCAT44(fVar7,fVar7);
        local_e20[0x20] = (fVar3 - fVar4) * fVar7;
        local_e20[0x21] = (fVar8 - fVar9) * fVar7;
        local_e20[0x22] = (fVar12 - fVar13) * fVar7;
        local_e20[0x23] = (fVar23 - fVar24) * fVar7;
        local_488 = CONCAT44(fVar11,fVar6);
        uStack_480 = CONCAT44(fVar26,fVar15);
        local_498 = CONCAT44(fVar10,fVar5);
        uStack_490 = CONCAT44(fVar25,fVar14);
        local_e20[0x40] = fVar6 + fVar5;
        local_e20[0x41] = fVar11 + fVar10;
        local_e20[0x42] = fVar15 + fVar14;
        local_e20[0x43] = fVar26 + fVar25;
        local_168 = CONCAT44(fVar11,fVar6);
        uStack_160 = CONCAT44(fVar26,fVar15);
        local_178 = CONCAT44(fVar10,fVar5);
        uStack_170 = CONCAT44(fVar25,fVar14);
        fVar7 = ma_dr_mp3d_DCT_II::g_sec[(long)(local_c08 * 3) + 2];
        local_a68 = fVar7;
        local_a78 = fVar7;
        fStack_a74 = fVar7;
        fStack_a70 = fVar7;
        fStack_a6c = fVar7;
        local_868 = fVar6 - fVar5;
        fStack_864 = fVar11 - fVar10;
        fStack_860 = fVar15 - fVar14;
        fStack_85c = fVar26 - fVar25;
        local_878 = CONCAT44(fVar7,fVar7);
        uStack_870 = CONCAT44(fVar7,fVar7);
        local_e20[0x60] = (fVar6 - fVar5) * fVar7;
        local_e20[0x61] = (fVar11 - fVar10) * fVar7;
        local_e20[0x62] = (fVar15 - fVar14) * fVar7;
        local_e20[99] = (fVar26 - fVar25) * fVar7;
        local_e20 = local_e20 + 4;
      }
      local_e20 = local_e18;
      for (local_c08 = 0; local_c08 < 4; local_c08 = local_c08 + 1) {
        local_4a8 = *(undefined8 *)local_e20;
        uStack_4a0 = *(undefined8 *)(local_e20 + 2);
        local_4c8 = *(undefined8 *)(local_e20 + 4);
        uStack_4c0 = *(undefined8 *)(local_e20 + 6);
        local_4e8 = *(undefined8 *)(local_e20 + 8);
        uStack_4e0 = *(undefined8 *)(local_e20 + 10);
        local_508 = *(undefined8 *)(local_e20 + 0xc);
        uStack_500 = *(undefined8 *)(local_e20 + 0xe);
        local_518 = *(undefined8 *)(local_e20 + 0x10);
        uStack_510 = *(undefined8 *)(local_e20 + 0x12);
        local_4f8 = *(undefined8 *)(local_e20 + 0x14);
        uStack_4f0 = *(undefined8 *)(local_e20 + 0x16);
        local_4d8 = *(undefined8 *)(local_e20 + 0x18);
        uStack_4d0 = *(undefined8 *)(local_e20 + 0x1a);
        local_4b8 = *(undefined8 *)(local_e20 + 0x1c);
        uStack_4b0 = *(undefined8 *)(local_e20 + 0x1e);
        local_188 = local_4a8;
        uStack_180 = uStack_4a0;
        local_198 = local_4b8;
        uStack_190 = uStack_4b0;
        local_188._0_4_ = (float)local_4a8;
        local_188._4_4_ = (float)((ulong)local_4a8 >> 0x20);
        uStack_180._0_4_ = (float)uStack_4a0;
        uStack_180._4_4_ = (float)((ulong)uStack_4a0 >> 0x20);
        local_198._0_4_ = (float)local_4b8;
        local_198._4_4_ = (float)((ulong)local_4b8 >> 0x20);
        uStack_190._0_4_ = (float)uStack_4b0;
        uStack_190._4_4_ = (float)((ulong)uStack_4b0 >> 0x20);
        fVar10 = (float)local_188 - (float)local_198;
        fVar25 = local_188._4_4_ - local_198._4_4_;
        fVar16 = (float)uStack_180 - (float)uStack_190;
        fVar27 = uStack_180._4_4_ - uStack_190._4_4_;
        local_188._0_4_ = (float)local_188 + (float)local_198;
        local_188._4_4_ = local_188._4_4_ + local_198._4_4_;
        uStack_180._0_4_ = (float)uStack_180 + (float)uStack_190;
        uStack_180._4_4_ = uStack_180._4_4_ + uStack_190._4_4_;
        local_eb8 = CONCAT44(local_188._4_4_,(float)local_188);
        uStack_eb0 = CONCAT44(uStack_180._4_4_,(float)uStack_180);
        local_1a8 = local_4c8;
        uStack_1a0 = uStack_4c0;
        local_1b8 = local_4d8;
        uStack_1b0 = uStack_4d0;
        local_1a8._0_4_ = (float)local_4c8;
        local_1a8._4_4_ = (float)((ulong)local_4c8 >> 0x20);
        uStack_1a0._0_4_ = (float)uStack_4c0;
        uStack_1a0._4_4_ = (float)((ulong)uStack_4c0 >> 0x20);
        local_1b8._0_4_ = (float)local_4d8;
        local_1b8._4_4_ = (float)((ulong)local_4d8 >> 0x20);
        uStack_1b0._0_4_ = (float)uStack_4d0;
        uStack_1b0._4_4_ = (float)((ulong)uStack_4d0 >> 0x20);
        fVar9 = (float)local_1a8 - (float)local_1b8;
        fVar24 = local_1a8._4_4_ - local_1b8._4_4_;
        fVar17 = (float)uStack_1a0 - (float)uStack_1b0;
        fVar28 = uStack_1a0._4_4_ - uStack_1b0._4_4_;
        local_f28 = CONCAT44(fVar24,fVar9);
        uStack_f20 = CONCAT44(fVar28,fVar17);
        fVar7 = (float)local_1a8 + (float)local_1b8;
        fVar11 = local_1a8._4_4_ + local_1b8._4_4_;
        fVar26 = (float)uStack_1a0 + (float)uStack_1b0;
        fVar29 = uStack_1a0._4_4_ + uStack_1b0._4_4_;
        local_ec8 = CONCAT44(fVar11,fVar7);
        uStack_ec0 = CONCAT44(fVar29,fVar26);
        local_1c8 = local_4e8;
        uStack_1c0 = uStack_4e0;
        local_1d8 = local_4f8;
        uStack_1d0 = uStack_4f0;
        local_1c8._0_4_ = (float)local_4e8;
        local_1c8._4_4_ = (float)((ulong)local_4e8 >> 0x20);
        uStack_1c0._0_4_ = (float)uStack_4e0;
        uStack_1c0._4_4_ = (float)((ulong)uStack_4e0 >> 0x20);
        local_1d8._0_4_ = (float)local_4f8;
        local_1d8._4_4_ = (float)((ulong)local_4f8 >> 0x20);
        uStack_1d0._0_4_ = (float)uStack_4f0;
        uStack_1d0._4_4_ = (float)((ulong)uStack_4f0 >> 0x20);
        fVar3 = (float)local_1c8 - (float)local_1d8;
        fVar12 = local_1c8._4_4_ - local_1d8._4_4_;
        fVar18 = (float)uStack_1c0 - (float)uStack_1d0;
        fVar30 = uStack_1c0._4_4_ - uStack_1d0._4_4_;
        local_f18 = CONCAT44(fVar12,fVar3);
        uStack_f10 = CONCAT44(fVar30,fVar18);
        fVar4 = (float)local_1c8 + (float)local_1d8;
        fVar13 = local_1c8._4_4_ + local_1d8._4_4_;
        fVar19 = (float)uStack_1c0 + (float)uStack_1d0;
        fVar31 = uStack_1c0._4_4_ + uStack_1d0._4_4_;
        local_ed8 = CONCAT44(fVar13,fVar4);
        uStack_ed0 = CONCAT44(fVar31,fVar19);
        local_1e8 = local_508;
        uStack_1e0 = uStack_500;
        local_1f8 = local_518;
        uStack_1f0 = uStack_510;
        local_1e8._0_4_ = (float)local_508;
        local_1e8._4_4_ = (float)((ulong)local_508 >> 0x20);
        uStack_1e0._0_4_ = (float)uStack_500;
        uStack_1e0._4_4_ = (float)((ulong)uStack_500 >> 0x20);
        local_1f8._0_4_ = (float)local_518;
        local_1f8._4_4_ = (float)((ulong)local_518 >> 0x20);
        uStack_1f0._0_4_ = (float)uStack_510;
        uStack_1f0._4_4_ = (float)((ulong)uStack_510 >> 0x20);
        local_f08 = CONCAT44(local_1e8._4_4_ - local_1f8._4_4_,(float)local_1e8 - (float)local_1f8);
        uStack_f00 = CONCAT44(uStack_1e0._4_4_ - uStack_1f0._4_4_,
                              (float)uStack_1e0 - (float)uStack_1f0);
        fVar6 = (float)local_1e8 + (float)local_1f8;
        fVar15 = local_1e8._4_4_ + local_1f8._4_4_;
        fVar20 = (float)uStack_1e0 + (float)uStack_1f0;
        fVar32 = uStack_1e0._4_4_ + uStack_1f0._4_4_;
        local_ee8 = CONCAT44(fVar15,fVar6);
        uStack_ee0 = CONCAT44(fVar32,fVar20);
        local_208 = local_eb8;
        uStack_200 = uStack_eb0;
        local_218 = local_ee8;
        uStack_210 = uStack_ee0;
        fVar5 = (float)local_188 - fVar6;
        fVar14 = local_188._4_4_ - fVar15;
        fVar21 = (float)uStack_180 - fVar20;
        fVar33 = uStack_180._4_4_ - fVar32;
        local_ef8 = CONCAT44(fVar14,fVar5);
        uStack_ef0 = CONCAT44(fVar33,fVar21);
        local_528 = local_eb8;
        uStack_520 = uStack_eb0;
        local_538 = local_ee8;
        uStack_530 = uStack_ee0;
        fVar6 = (float)local_188 + fVar6;
        fVar15 = local_188._4_4_ + fVar15;
        fVar20 = (float)uStack_180 + fVar20;
        fVar32 = uStack_180._4_4_ + fVar32;
        local_eb8 = CONCAT44(fVar15,fVar6);
        uStack_eb0 = CONCAT44(fVar32,fVar20);
        local_228 = local_ec8;
        uStack_220 = uStack_ec0;
        local_238 = local_ed8;
        uStack_230 = uStack_ed0;
        local_ee8 = CONCAT44(fVar11 - fVar13,fVar7 - fVar4);
        uStack_ee0 = CONCAT44(fVar29 - fVar31,fVar26 - fVar19);
        local_548 = local_ec8;
        uStack_540 = uStack_ec0;
        local_558 = local_ed8;
        uStack_550 = uStack_ed0;
        fVar8 = fVar7 + fVar4;
        fVar23 = fVar11 + fVar13;
        fVar22 = fVar26 + fVar19;
        fVar34 = fVar29 + fVar31;
        local_ec8 = CONCAT44(fVar23,fVar8);
        uStack_ec0 = CONCAT44(fVar34,fVar22);
        local_568 = local_eb8;
        uStack_560 = uStack_eb0;
        local_578 = local_ec8;
        uStack_570 = uStack_ec0;
        *local_e20 = fVar6 + fVar8;
        local_e20[1] = fVar15 + fVar23;
        local_e20[2] = fVar20 + fVar22;
        local_e20[3] = fVar32 + fVar34;
        local_248 = local_eb8;
        uStack_240 = uStack_eb0;
        local_258 = local_ec8;
        uStack_250 = uStack_ec0;
        local_a7c = 0x3f3504f3;
        local_a98 = 0x3f3504f3;
        uStack_a94 = 0x3f3504f3;
        uStack_a90 = 0x3f3504f3;
        uStack_a8c = 0x3f3504f3;
        local_888 = fVar6 - fVar8;
        fStack_884 = fVar15 - fVar23;
        fStack_880 = fVar20 - fVar22;
        fStack_87c = fVar32 - fVar34;
        local_898 = 0x3f3504f33f3504f3;
        uStack_890 = 0x3f3504f33f3504f3;
        local_e20[0x10] = (fVar6 - fVar8) * 0.70710677;
        local_e20[0x11] = (fVar15 - fVar23) * 0.70710677;
        local_e20[0x12] = (fVar20 - fVar22) * 0.70710677;
        local_e20[0x13] = (fVar32 - fVar34) * 0.70710677;
        local_588 = local_f08;
        uStack_580 = uStack_f00;
        local_598 = local_f18;
        uStack_590 = uStack_f10;
        fVar6 = ((float)local_1e8 - (float)local_1f8) + fVar3;
        fVar15 = (local_1e8._4_4_ - local_1f8._4_4_) + fVar12;
        fVar20 = ((float)uStack_1e0 - (float)uStack_1f0) + fVar18;
        fVar22 = (uStack_1e0._4_4_ - uStack_1f0._4_4_) + fVar30;
        local_f08 = CONCAT44(fVar15,fVar6);
        uStack_f00 = CONCAT44(fVar22,fVar20);
        local_5a8 = local_f18;
        uStack_5a0 = uStack_f10;
        local_5b8 = local_f28;
        uStack_5b0 = uStack_f20;
        local_a9c = 0x3f3504f3;
        local_ab8 = 0x3f3504f3;
        uStack_ab4 = 0x3f3504f3;
        uStack_ab0 = 0x3f3504f3;
        uStack_aac = 0x3f3504f3;
        local_8a8 = fVar3 + fVar9;
        fStack_8a4 = fVar12 + fVar24;
        fStack_8a0 = fVar18 + fVar17;
        fStack_89c = fVar30 + fVar28;
        local_8b8 = 0x3f3504f33f3504f3;
        uStack_8b0 = 0x3f3504f33f3504f3;
        fVar3 = (fVar3 + fVar9) * 0.70710677;
        fVar8 = (fVar12 + fVar24) * 0.70710677;
        fVar23 = (fVar18 + fVar17) * 0.70710677;
        fVar18 = (fVar30 + fVar28) * 0.70710677;
        local_f18 = CONCAT44(fVar8,fVar3);
        uStack_f10 = CONCAT44(fVar18,fVar23);
        local_5c8 = local_f28;
        uStack_5c0 = uStack_f20;
        local_5d8 = CONCAT44(fVar25,fVar10);
        uStack_5d0 = CONCAT44(fVar27,fVar16);
        fVar9 = fVar9 + fVar10;
        fVar24 = fVar24 + fVar25;
        fVar17 = fVar17 + fVar16;
        fVar28 = fVar28 + fVar27;
        local_f28 = CONCAT44(fVar24,fVar9);
        uStack_f20 = CONCAT44(fVar28,fVar17);
        local_5e8 = local_ee8;
        uStack_5e0 = uStack_ee0;
        local_5f8 = local_ef8;
        uStack_5f0 = uStack_ef0;
        local_8c8 = (fVar7 - fVar4) + fVar5;
        fStack_8c4 = (fVar11 - fVar13) + fVar14;
        fStack_8c0 = (fVar26 - fVar19) + fVar21;
        fStack_8bc = (fVar29 - fVar31) + fVar33;
        local_abc = 0x3f3504f3;
        local_ad8 = 0x3f3504f3;
        uStack_ad4 = 0x3f3504f3;
        uStack_ad0 = 0x3f3504f3;
        uStack_acc = 0x3f3504f3;
        local_8d8 = 0x3f3504f33f3504f3;
        uStack_8d0 = 0x3f3504f33f3504f3;
        fVar7 = local_8c8 * 0.70710677;
        fVar11 = fStack_8c4 * 0.70710677;
        fVar13 = fStack_8c0 * 0.70710677;
        fVar19 = fStack_8bc * 0.70710677;
        local_ee8 = CONCAT44(fVar11,fVar7);
        uStack_ee0 = CONCAT44(fVar19,fVar13);
        local_adc = 0x3e4bafaf;
        local_af8 = 0x3e4bafaf;
        uStack_af4 = 0x3e4bafaf;
        uStack_af0 = 0x3e4bafaf;
        uStack_aec = 0x3e4bafaf;
        local_8e8 = local_f28;
        uStack_8e0 = uStack_f20;
        local_8f8 = 0x3e4bafaf3e4bafaf;
        uStack_8f0 = 0x3e4bafaf3e4bafaf;
        local_268 = local_f08;
        uStack_260 = uStack_f00;
        local_278 = fVar9 * 0.19891237;
        fStack_274 = fVar24 * 0.19891237;
        fStack_270 = fVar17 * 0.19891237;
        fStack_26c = fVar28 * 0.19891237;
        fVar6 = fVar6 - fVar9 * 0.19891237;
        fVar15 = fVar15 - fVar24 * 0.19891237;
        fVar20 = fVar20 - fVar17 * 0.19891237;
        fVar22 = fVar22 - fVar28 * 0.19891237;
        local_f08 = CONCAT44(fVar15,fVar6);
        uStack_f00 = CONCAT44(fVar22,fVar20);
        local_afc = 0x3ec3ef15;
        local_b18 = 0x3ec3ef15;
        uStack_b14 = 0x3ec3ef15;
        uStack_b10 = 0x3ec3ef15;
        uStack_b0c = 0x3ec3ef15;
        local_908 = local_f08;
        uStack_900 = uStack_f00;
        local_918 = 0x3ec3ef153ec3ef15;
        uStack_910 = 0x3ec3ef153ec3ef15;
        local_608 = local_f28;
        uStack_600 = uStack_f20;
        local_618 = fVar6 * 0.38268343;
        fStack_614 = fVar15 * 0.38268343;
        fStack_610 = fVar20 * 0.38268343;
        fStack_60c = fVar22 * 0.38268343;
        fVar9 = fVar9 + fVar6 * 0.38268343;
        fVar24 = fVar24 + fVar15 * 0.38268343;
        fVar17 = fVar17 + fVar20 * 0.38268343;
        fVar28 = fVar28 + fVar22 * 0.38268343;
        local_f28 = CONCAT44(fVar24,fVar9);
        uStack_f20 = CONCAT44(fVar28,fVar17);
        local_b1c = 0x3e4bafaf;
        local_b38 = 0x3e4bafaf;
        uStack_b34 = 0x3e4bafaf;
        uStack_b30 = 0x3e4bafaf;
        uStack_b2c = 0x3e4bafaf;
        local_928 = local_f28;
        uStack_920 = uStack_f20;
        local_938 = 0x3e4bafaf3e4bafaf;
        uStack_930 = 0x3e4bafaf3e4bafaf;
        local_288 = local_f08;
        uStack_280 = uStack_f00;
        local_298 = fVar9 * 0.19891237;
        fStack_294 = fVar24 * 0.19891237;
        fStack_290 = fVar17 * 0.19891237;
        fStack_28c = fVar28 * 0.19891237;
        fVar6 = fVar6 - fVar9 * 0.19891237;
        fVar15 = fVar15 - fVar24 * 0.19891237;
        fVar20 = fVar20 - fVar17 * 0.19891237;
        fVar22 = fVar22 - fVar28 * 0.19891237;
        local_f08 = CONCAT44(fVar15,fVar6);
        uStack_f00 = CONCAT44(fVar22,fVar20);
        local_2a8 = CONCAT44(fVar25,fVar10);
        uStack_2a0 = CONCAT44(fVar27,fVar16);
        local_2b8 = local_f18;
        uStack_2b0 = uStack_f10;
        fVar4 = fVar10 - fVar3;
        fVar12 = fVar25 - fVar8;
        fVar26 = fVar16 - fVar23;
        fVar29 = fVar27 - fVar18;
        local_eb8 = CONCAT44(fVar12,fVar4);
        uStack_eb0 = CONCAT44(fVar29,fVar26);
        local_628 = CONCAT44(fVar25,fVar10);
        uStack_620 = CONCAT44(fVar27,fVar16);
        local_638 = local_f18;
        uStack_630 = uStack_f10;
        fVar10 = fVar10 + fVar3;
        fVar25 = fVar25 + fVar8;
        fVar16 = fVar16 + fVar23;
        fVar27 = fVar27 + fVar18;
        local_648 = CONCAT44(fVar25,fVar10);
        uStack_640 = CONCAT44(fVar27,fVar16);
        local_658 = local_f28;
        uStack_650 = uStack_f20;
        local_b3c = 0x3f0281f7;
        local_b58 = 0x3f0281f7;
        uStack_b54 = 0x3f0281f7;
        uStack_b50 = 0x3f0281f7;
        uStack_b4c = 0x3f0281f7;
        local_948 = fVar10 + fVar9;
        fStack_944 = fVar25 + fVar24;
        fStack_940 = fVar16 + fVar17;
        fStack_93c = fVar27 + fVar28;
        local_958 = 0x3f0281f73f0281f7;
        uStack_950 = 0x3f0281f73f0281f7;
        local_e20[4] = (fVar10 + fVar9) * 0.5097956;
        local_e20[5] = (fVar25 + fVar24) * 0.5097956;
        local_e20[6] = (fVar16 + fVar17) * 0.5097956;
        local_e20[7] = (fVar27 + fVar28) * 0.5097956;
        local_668 = local_ef8;
        uStack_660 = uStack_ef0;
        local_678 = local_ee8;
        uStack_670 = uStack_ee0;
        local_b5c = 0x3f0a8bd4;
        local_b78 = 0x3f0a8bd4;
        uStack_b74 = 0x3f0a8bd4;
        uStack_b70 = 0x3f0a8bd4;
        uStack_b6c = 0x3f0a8bd4;
        local_968 = fVar5 + fVar7;
        fStack_964 = fVar14 + fVar11;
        fStack_960 = fVar21 + fVar13;
        fStack_95c = fVar33 + fVar19;
        local_978 = 0x3f0a8bd43f0a8bd4;
        uStack_970 = 0x3f0a8bd43f0a8bd4;
        local_e20[8] = (fVar5 + fVar7) * 0.5411961;
        local_e20[9] = (fVar14 + fVar11) * 0.5411961;
        local_e20[10] = (fVar21 + fVar13) * 0.5411961;
        local_e20[0xb] = (fVar33 + fVar19) * 0.5411961;
        local_2c8 = local_eb8;
        uStack_2c0 = uStack_eb0;
        local_2d8 = local_f08;
        uStack_2d0 = uStack_f00;
        local_b7c = 0x3f19f1bd;
        local_b98 = 0x3f19f1bd;
        uStack_b94 = 0x3f19f1bd;
        uStack_b90 = 0x3f19f1bd;
        uStack_b8c = 0x3f19f1bd;
        local_988 = fVar4 - fVar6;
        fStack_984 = fVar12 - fVar15;
        fStack_980 = fVar26 - fVar20;
        fStack_97c = fVar29 - fVar22;
        local_998 = 0x3f19f1bd3f19f1bd;
        uStack_990 = 0x3f19f1bd3f19f1bd;
        local_e20[0xc] = (fVar4 - fVar6) * 0.6013449;
        local_e20[0xd] = (fVar12 - fVar15) * 0.6013449;
        local_e20[0xe] = (fVar26 - fVar20) * 0.6013449;
        local_e20[0xf] = (fVar29 - fVar22) * 0.6013449;
        local_688 = local_eb8;
        uStack_680 = uStack_eb0;
        local_698 = local_f08;
        uStack_690 = uStack_f00;
        local_b9c = 0x3f6664d7;
        local_bb8 = 0x3f6664d7;
        uStack_bb4 = 0x3f6664d7;
        uStack_bb0 = 0x3f6664d7;
        uStack_bac = 0x3f6664d7;
        local_9a8 = fVar4 + fVar6;
        fStack_9a4 = fVar12 + fVar15;
        fStack_9a0 = fVar26 + fVar20;
        fStack_99c = fVar29 + fVar22;
        local_9b8 = 0x3f6664d73f6664d7;
        uStack_9b0 = 0x3f6664d73f6664d7;
        local_e20[0x14] = (fVar4 + fVar6) * 0.8999762;
        local_e20[0x15] = (fVar12 + fVar15) * 0.8999762;
        local_e20[0x16] = (fVar26 + fVar20) * 0.8999762;
        local_e20[0x17] = (fVar29 + fVar22) * 0.8999762;
        local_2e8 = local_ef8;
        uStack_2e0 = uStack_ef0;
        local_2f8 = local_ee8;
        uStack_2f0 = uStack_ee0;
        local_bbc = 0x3fa73d75;
        local_bd8 = 0x3fa73d75;
        uStack_bd4 = 0x3fa73d75;
        uStack_bd0 = 0x3fa73d75;
        uStack_bcc = 0x3fa73d75;
        local_9c8 = fVar5 - fVar7;
        fStack_9c4 = fVar14 - fVar11;
        fStack_9c0 = fVar21 - fVar13;
        fStack_9bc = fVar33 - fVar19;
        local_9d8 = 0x3fa73d753fa73d75;
        uStack_9d0 = 0x3fa73d753fa73d75;
        local_e20[0x18] = (fVar5 - fVar7) * 1.306563;
        local_e20[0x19] = (fVar14 - fVar11) * 1.306563;
        local_e20[0x1a] = (fVar21 - fVar13) * 1.306563;
        local_e20[0x1b] = (fVar33 - fVar19) * 1.306563;
        local_308 = CONCAT44(fVar25,fVar10);
        uStack_300 = CONCAT44(fVar27,fVar16);
        local_318 = local_f28;
        uStack_310 = uStack_f20;
        local_be8 = 0x402406cf;
        local_bf8 = 0x402406cf;
        uStack_bf4 = 0x402406cf;
        uStack_bf0 = 0x402406cf;
        uStack_bec = 0x402406cf;
        local_9e8 = fVar10 - fVar9;
        fStack_9e4 = fVar25 - fVar24;
        fStack_9e0 = fVar16 - fVar17;
        fStack_9dc = fVar27 - fVar28;
        local_9f8 = 0x402406cf402406cf;
        uStack_9f0 = 0x402406cf402406cf;
        local_e20[0x1c] = (fVar10 - fVar9) * 2.5629156;
        local_e20[0x1d] = (fVar25 - fVar24) * 2.5629156;
        local_e20[0x1e] = (fVar16 - fVar17) * 2.5629156;
        local_e20[0x1f] = (fVar27 - fVar28) * 2.5629156;
        local_e20 = local_e20 + 0x20;
      }
      local_728._0_4_ = (float)auStack_d08[0xc];
      fVar6 = (float)local_728;
      local_728._4_4_ = (float)((ulong)auStack_d08[0xc] >> 0x20);
      fVar8 = local_728._4_4_;
      uStack_720._0_4_ = (float)auStack_d08[0xd];
      fVar9 = (float)uStack_720;
      uStack_720._4_4_ = (float)((ulong)auStack_d08[0xd] >> 0x20);
      fVar10 = uStack_720._4_4_;
      local_738._0_4_ = (float)auStack_c88[0xc];
      fVar7 = (float)local_738;
      local_738._4_4_ = (float)((ulong)auStack_c88[0xc] >> 0x20);
      fVar3 = local_738._4_4_;
      uStack_730._0_4_ = (float)auStack_c88[0xd];
      fVar4 = (float)uStack_730;
      uStack_730._4_4_ = (float)((ulong)auStack_c88[0xd] >> 0x20);
      fVar5 = uStack_730._4_4_;
      if (local_c04 + -3 < local_c0c) {
        for (local_c08 = 0; local_c08 < 7; local_c08 = local_c08 + 1) {
          lVar2 = (long)local_c08;
          local_6a8 = *(undefined8 *)(local_c98 + lVar2 * 4);
          uStack_6a0 = (&uStack_c90)[lVar2 * 2];
          local_6b8 = auStack_c88[lVar2 * 2];
          uStack_6b0 = auStack_c88[lVar2 * 2 + 1];
          local_6a8._4_4_ = (float)((ulong)local_6a8 >> 0x20);
          uStack_6a0._4_4_ = (float)((ulong)uStack_6a0 >> 0x20);
          local_6b8._4_4_ = (float)((ulong)local_6b8 >> 0x20);
          uStack_6b0._4_4_ = (float)((ulong)uStack_6b0 >> 0x20);
          local_6a8._0_4_ = (float)local_6a8 + (float)local_6b8;
          local_6a8._4_4_ = local_6a8._4_4_ + local_6b8._4_4_;
          uStack_6a0._0_4_ = (float)uStack_6a0 + (float)uStack_6b0;
          uStack_6a0._4_4_ = uStack_6a0._4_4_ + uStack_6b0._4_4_;
          local_8 = local_e28;
          local_18 = *(undefined8 *)(local_e18 + (long)local_c08 * 4);
          uStack_10 = (&uStack_e10)[(long)local_c08 * 2];
          *local_e28 = *(undefined8 *)(local_e18 + (long)local_c08 * 4);
          local_6c8 = *(undefined8 *)(local_d18 + (long)local_c08 * 4);
          uStack_6c0 = (&uStack_d10)[(long)local_c08 * 2];
          local_6d8 = CONCAT44(local_6a8._4_4_,(float)local_6a8);
          uStack_6d0 = CONCAT44(uStack_6a0._4_4_,(float)uStack_6a0);
          local_6c8._4_4_ = (float)((ulong)local_6c8 >> 0x20);
          uStack_6c0._4_4_ = (float)((ulong)uStack_6c0 >> 0x20);
          local_20 = local_e28 + 9;
          local_38 = (float)local_6c8 + (float)local_6a8;
          fStack_34 = local_6c8._4_4_ + local_6a8._4_4_;
          fStack_30 = (float)uStack_6c0 + (float)uStack_6a0;
          fStack_2c = uStack_6c0._4_4_ + uStack_6a0._4_4_;
          local_e28[9] = CONCAT44(local_6c8._4_4_ + local_6a8._4_4_,
                                  (float)local_6c8 + (float)local_6a8);
          lVar2 = (long)local_c08;
          local_6e8 = *(undefined8 *)(local_d98 + lVar2 * 4);
          uStack_6e0 = (&uStack_d90)[lVar2 * 2];
          local_6f8 = auStack_d88[lVar2 * 2];
          uStack_6f0 = auStack_d88[lVar2 * 2 + 1];
          local_6e8._4_4_ = (float)((ulong)local_6e8 >> 0x20);
          uStack_6e0._4_4_ = (float)((ulong)uStack_6e0 >> 0x20);
          local_6f8._4_4_ = (float)((ulong)local_6f8 >> 0x20);
          uStack_6f0._4_4_ = (float)((ulong)uStack_6f0 >> 0x20);
          local_40 = local_e28 + 0x12;
          local_58 = (float)local_6e8 + (float)local_6f8;
          fStack_54 = local_6e8._4_4_ + local_6f8._4_4_;
          fStack_50 = (float)uStack_6e0 + (float)uStack_6f0;
          fStack_4c = uStack_6e0._4_4_ + uStack_6f0._4_4_;
          local_e28[0x12] =
               CONCAT44(local_6e8._4_4_ + local_6f8._4_4_,(float)local_6e8 + (float)local_6f8);
          local_708 = auStack_d08[(long)local_c08 * 2];
          uStack_700 = auStack_d08[(long)local_c08 * 2 + 1];
          local_718 = CONCAT44(local_6a8._4_4_,(float)local_6a8);
          uStack_710 = CONCAT44(uStack_6a0._4_4_,(float)uStack_6a0);
          local_708._4_4_ = (float)((ulong)local_708 >> 0x20);
          uStack_700._4_4_ = (float)((ulong)uStack_700 >> 0x20);
          local_60 = local_e28 + 0x1b;
          local_78 = (float)local_708 + (float)local_6a8;
          fStack_74 = local_708._4_4_ + local_6a8._4_4_;
          fStack_70 = (float)uStack_700 + (float)uStack_6a0;
          fStack_6c = uStack_700._4_4_ + uStack_6a0._4_4_;
          local_e28[0x1b] =
               CONCAT44(local_708._4_4_ + local_6a8._4_4_,(float)local_708 + (float)local_6a8);
          local_e28 = local_e28 + 0x24;
        }
        local_80 = local_e28;
        local_98 = local_da8;
        uStack_90 = uStack_da0;
        *local_e28 = local_da8;
        local_728 = auStack_d08[0xc];
        uStack_720 = auStack_d08[0xd];
        local_738 = auStack_c88[0xc];
        uStack_730 = auStack_c88[0xd];
        local_a0 = local_e28 + 9;
        local_b8 = fVar6 + fVar7;
        fStack_b4 = fVar8 + fVar3;
        fStack_b0 = fVar9 + fVar4;
        fStack_ac = fVar10 + fVar5;
        local_e28[9] = CONCAT44(fVar8 + fVar3,fVar6 + fVar7);
        local_c0 = local_e28 + 0x12;
        local_d8 = auStack_d88[0xc];
        uStack_d0 = auStack_d88[0xd];
        local_e28[0x12] = auStack_d88[0xc];
        local_e0 = local_e28 + 0x1b;
        local_f8 = auStack_c88[0xc];
        uStack_f0 = auStack_c88[0xd];
        local_e28[0x1b] = auStack_c88[0xc];
      }
      else {
        for (local_c08 = 0; local_c08 < 7; local_c08 = local_c08 + 1) {
          local_748 = *(undefined8 *)(local_c98 + (long)local_c08 * 4);
          uStack_740 = (&uStack_c90)[(long)local_c08 * 2];
          local_758 = *(undefined8 *)(local_c98 + (long)(local_c08 + 1) * 4);
          uStack_750 = (&uStack_c90)[(long)(local_c08 + 1) * 2];
          local_748._4_4_ = (float)((ulong)local_748 >> 0x20);
          uStack_740._4_4_ = (float)((ulong)uStack_740 >> 0x20);
          local_758._4_4_ = (float)((ulong)local_758 >> 0x20);
          uStack_750._4_4_ = (float)((ulong)uStack_750 >> 0x20);
          local_748._0_4_ = (float)local_748 + (float)local_758;
          local_748._4_4_ = local_748._4_4_ + local_758._4_4_;
          uStack_740._0_4_ = (float)uStack_740 + (float)uStack_750;
          uStack_740._4_4_ = uStack_740._4_4_ + uStack_750._4_4_;
          uStack_330 = (&uStack_e10)[(long)local_c08 * 2];
          local_320 = local_e28;
          local_338 = *(undefined8 *)(local_e18 + (long)local_c08 * 4);
          *local_e28 = *(undefined8 *)(local_e18 + (long)local_c08 * 4);
          local_e28[1] = uStack_330;
          local_768 = *(undefined8 *)(local_d18 + (long)local_c08 * 4);
          uStack_760 = (&uStack_d10)[(long)local_c08 * 2];
          local_778 = CONCAT44(local_748._4_4_,(float)local_748);
          uStack_770 = CONCAT44(uStack_740._4_4_,(float)uStack_740);
          local_768._4_4_ = (float)((ulong)local_768 >> 0x20);
          uStack_760._4_4_ = (float)((ulong)uStack_760 >> 0x20);
          local_340 = local_e28 + 9;
          local_358 = (float)local_768 + (float)local_748;
          fStack_354 = local_768._4_4_ + local_748._4_4_;
          fStack_350 = (float)uStack_760 + (float)uStack_740;
          fStack_34c = uStack_760._4_4_ + uStack_740._4_4_;
          local_e28[9] = CONCAT44(local_768._4_4_ + local_748._4_4_,
                                  (float)local_768 + (float)local_748);
          local_e28[10] =
               CONCAT44(uStack_760._4_4_ + uStack_740._4_4_,(float)uStack_760 + (float)uStack_740);
          local_788 = *(undefined8 *)(local_d98 + (long)local_c08 * 4);
          uStack_780 = (&uStack_d90)[(long)local_c08 * 2];
          local_798 = *(undefined8 *)(local_d98 + (long)(local_c08 + 1) * 4);
          uStack_790 = (&uStack_d90)[(long)(local_c08 + 1) * 2];
          local_788._4_4_ = (float)((ulong)local_788 >> 0x20);
          uStack_780._4_4_ = (float)((ulong)uStack_780 >> 0x20);
          local_798._4_4_ = (float)((ulong)local_798 >> 0x20);
          uStack_790._4_4_ = (float)((ulong)uStack_790 >> 0x20);
          local_360 = local_e28 + 0x12;
          local_378 = (float)local_788 + (float)local_798;
          fStack_374 = local_788._4_4_ + local_798._4_4_;
          fStack_370 = (float)uStack_780 + (float)uStack_790;
          fStack_36c = uStack_780._4_4_ + uStack_790._4_4_;
          local_e28[0x12] =
               CONCAT44(local_788._4_4_ + local_798._4_4_,(float)local_788 + (float)local_798);
          local_e28[0x13] =
               CONCAT44(uStack_780._4_4_ + uStack_790._4_4_,(float)uStack_780 + (float)uStack_790);
          local_7a8 = *(undefined8 *)(local_d18 + (long)(local_c08 + 1) * 4);
          uStack_7a0 = (&uStack_d10)[(long)(local_c08 + 1) * 2];
          local_7b8 = CONCAT44(local_748._4_4_,(float)local_748);
          uStack_7b0 = CONCAT44(uStack_740._4_4_,(float)uStack_740);
          local_7a8._4_4_ = (float)((ulong)local_7a8 >> 0x20);
          uStack_7a0._4_4_ = (float)((ulong)uStack_7a0 >> 0x20);
          local_380 = local_e28 + 0x1b;
          local_398 = (float)local_7a8 + (float)local_748;
          fStack_394 = local_7a8._4_4_ + local_748._4_4_;
          fStack_390 = (float)uStack_7a0 + (float)uStack_740;
          fStack_38c = uStack_7a0._4_4_ + uStack_740._4_4_;
          local_e28[0x1b] =
               CONCAT44(local_7a8._4_4_ + local_748._4_4_,(float)local_7a8 + (float)local_748);
          local_e28[0x1c] =
               CONCAT44(uStack_7a0._4_4_ + uStack_740._4_4_,(float)uStack_7a0 + (float)uStack_740);
          local_e28 = local_e28 + 0x24;
        }
        local_3a0 = local_e28;
        local_3b8 = local_da8;
        uStack_3b0 = uStack_da0;
        *local_e28 = local_da8;
        local_e28[1] = uStack_da0;
        local_7c8 = auStack_d08[0xc];
        uStack_7c0 = auStack_d08[0xd];
        local_7d8 = auStack_c88[0xc];
        uStack_7d0 = auStack_c88[0xd];
        local_3c0 = local_e28 + 9;
        local_3d8 = (float)local_728 + (float)local_738;
        fStack_3d4 = local_728._4_4_ + local_738._4_4_;
        fStack_3d0 = (float)uStack_720 + (float)uStack_730;
        fStack_3cc = uStack_720._4_4_ + uStack_730._4_4_;
        local_e28[9] = CONCAT44(local_728._4_4_ + local_738._4_4_,
                                (float)local_728 + (float)local_738);
        local_e28[10] =
             CONCAT44(uStack_720._4_4_ + uStack_730._4_4_,(float)uStack_720 + (float)uStack_730);
        local_3e0 = local_e28 + 0x12;
        local_3f8 = auStack_d88[0xc];
        uStack_3f0 = auStack_d88[0xd];
        local_e28[0x12] = auStack_d88[0xc];
        local_e28[0x13] = auStack_d88[0xd];
        local_400 = local_e28 + 0x1b;
        local_418 = auStack_c88[0xc];
        uStack_410 = auStack_c88[0xd];
        local_e28[0x1b] = auStack_c88[0xc];
        local_e28[0x1c] = auStack_c88[0xd];
      }
    }
  }
  return;
}

Assistant:

static void ma_dr_mp3d_DCT_II(float *grbuf, int n)
{
    static const float g_sec[24] = {
        10.19000816f,0.50060302f,0.50241929f,3.40760851f,0.50547093f,0.52249861f,2.05778098f,0.51544732f,0.56694406f,1.48416460f,0.53104258f,0.64682180f,1.16943991f,0.55310392f,0.78815460f,0.97256821f,0.58293498f,1.06067765f,0.83934963f,0.62250412f,1.72244716f,0.74453628f,0.67480832f,5.10114861f
    };
    int i, k = 0;
#if MA_DR_MP3_HAVE_SIMD
    if (ma_dr_mp3_have_simd()) for (; k < n; k += 4)
    {
        ma_dr_mp3_f4 t[4][8], *x;
        float *y = grbuf + k;
        for (x = t[0], i = 0; i < 8; i++, x++)
        {
            ma_dr_mp3_f4 x0 = MA_DR_MP3_VLD(&y[i*18]);
            ma_dr_mp3_f4 x1 = MA_DR_MP3_VLD(&y[(15 - i)*18]);
            ma_dr_mp3_f4 x2 = MA_DR_MP3_VLD(&y[(16 + i)*18]);
            ma_dr_mp3_f4 x3 = MA_DR_MP3_VLD(&y[(31 - i)*18]);
            ma_dr_mp3_f4 t0 = MA_DR_MP3_VADD(x0, x3);
            ma_dr_mp3_f4 t1 = MA_DR_MP3_VADD(x1, x2);
            ma_dr_mp3_f4 t2 = MA_DR_MP3_VMUL_S(MA_DR_MP3_VSUB(x1, x2), g_sec[3*i + 0]);
            ma_dr_mp3_f4 t3 = MA_DR_MP3_VMUL_S(MA_DR_MP3_VSUB(x0, x3), g_sec[3*i + 1]);
            x[0] = MA_DR_MP3_VADD(t0, t1);
            x[8] = MA_DR_MP3_VMUL_S(MA_DR_MP3_VSUB(t0, t1), g_sec[3*i + 2]);
            x[16] = MA_DR_MP3_VADD(t3, t2);
            x[24] = MA_DR_MP3_VMUL_S(MA_DR_MP3_VSUB(t3, t2), g_sec[3*i + 2]);
        }
        for (x = t[0], i = 0; i < 4; i++, x += 8)
        {
            ma_dr_mp3_f4 x0 = x[0], x1 = x[1], x2 = x[2], x3 = x[3], x4 = x[4], x5 = x[5], x6 = x[6], x7 = x[7], xt;
            xt = MA_DR_MP3_VSUB(x0, x7); x0 = MA_DR_MP3_VADD(x0, x7);
            x7 = MA_DR_MP3_VSUB(x1, x6); x1 = MA_DR_MP3_VADD(x1, x6);
            x6 = MA_DR_MP3_VSUB(x2, x5); x2 = MA_DR_MP3_VADD(x2, x5);
            x5 = MA_DR_MP3_VSUB(x3, x4); x3 = MA_DR_MP3_VADD(x3, x4);
            x4 = MA_DR_MP3_VSUB(x0, x3); x0 = MA_DR_MP3_VADD(x0, x3);
            x3 = MA_DR_MP3_VSUB(x1, x2); x1 = MA_DR_MP3_VADD(x1, x2);
            x[0] = MA_DR_MP3_VADD(x0, x1);
            x[4] = MA_DR_MP3_VMUL_S(MA_DR_MP3_VSUB(x0, x1), 0.70710677f);
            x5 = MA_DR_MP3_VADD(x5, x6);
            x6 = MA_DR_MP3_VMUL_S(MA_DR_MP3_VADD(x6, x7), 0.70710677f);
            x7 = MA_DR_MP3_VADD(x7, xt);
            x3 = MA_DR_MP3_VMUL_S(MA_DR_MP3_VADD(x3, x4), 0.70710677f);
            x5 = MA_DR_MP3_VSUB(x5, MA_DR_MP3_VMUL_S(x7, 0.198912367f));
            x7 = MA_DR_MP3_VADD(x7, MA_DR_MP3_VMUL_S(x5, 0.382683432f));
            x5 = MA_DR_MP3_VSUB(x5, MA_DR_MP3_VMUL_S(x7, 0.198912367f));
            x0 = MA_DR_MP3_VSUB(xt, x6); xt = MA_DR_MP3_VADD(xt, x6);
            x[1] = MA_DR_MP3_VMUL_S(MA_DR_MP3_VADD(xt, x7), 0.50979561f);
            x[2] = MA_DR_MP3_VMUL_S(MA_DR_MP3_VADD(x4, x3), 0.54119611f);
            x[3] = MA_DR_MP3_VMUL_S(MA_DR_MP3_VSUB(x0, x5), 0.60134488f);
            x[5] = MA_DR_MP3_VMUL_S(MA_DR_MP3_VADD(x0, x5), 0.89997619f);
            x[6] = MA_DR_MP3_VMUL_S(MA_DR_MP3_VSUB(x4, x3), 1.30656302f);
            x[7] = MA_DR_MP3_VMUL_S(MA_DR_MP3_VSUB(xt, x7), 2.56291556f);
        }
        if (k > n - 3)
        {
#if MA_DR_MP3_HAVE_SSE
#define MA_DR_MP3_VSAVE2(i, v) _mm_storel_pi((__m64 *)(void*)&y[i*18], v)
#else
#define MA_DR_MP3_VSAVE2(i, v) vst1_f32((float32_t *)&y[(i)*18],  vget_low_f32(v))
#endif
            for (i = 0; i < 7; i++, y += 4*18)
            {
                ma_dr_mp3_f4 s = MA_DR_MP3_VADD(t[3][i], t[3][i + 1]);
                MA_DR_MP3_VSAVE2(0, t[0][i]);
                MA_DR_MP3_VSAVE2(1, MA_DR_MP3_VADD(t[2][i], s));
                MA_DR_MP3_VSAVE2(2, MA_DR_MP3_VADD(t[1][i], t[1][i + 1]));
                MA_DR_MP3_VSAVE2(3, MA_DR_MP3_VADD(t[2][1 + i], s));
            }
            MA_DR_MP3_VSAVE2(0, t[0][7]);
            MA_DR_MP3_VSAVE2(1, MA_DR_MP3_VADD(t[2][7], t[3][7]));
            MA_DR_MP3_VSAVE2(2, t[1][7]);
            MA_DR_MP3_VSAVE2(3, t[3][7]);
        } else
        {
#define MA_DR_MP3_VSAVE4(i, v) MA_DR_MP3_VSTORE(&y[(i)*18], v)
            for (i = 0; i < 7; i++, y += 4*18)
            {
                ma_dr_mp3_f4 s = MA_DR_MP3_VADD(t[3][i], t[3][i + 1]);
                MA_DR_MP3_VSAVE4(0, t[0][i]);
                MA_DR_MP3_VSAVE4(1, MA_DR_MP3_VADD(t[2][i], s));
                MA_DR_MP3_VSAVE4(2, MA_DR_MP3_VADD(t[1][i], t[1][i + 1]));
                MA_DR_MP3_VSAVE4(3, MA_DR_MP3_VADD(t[2][1 + i], s));
            }
            MA_DR_MP3_VSAVE4(0, t[0][7]);
            MA_DR_MP3_VSAVE4(1, MA_DR_MP3_VADD(t[2][7], t[3][7]));
            MA_DR_MP3_VSAVE4(2, t[1][7]);
            MA_DR_MP3_VSAVE4(3, t[3][7]);
        }
    } else
#endif
#ifdef MA_DR_MP3_ONLY_SIMD
    {}
#else
    for (; k < n; k++)
    {
        float t[4][8], *x, *y = grbuf + k;
        for (x = t[0], i = 0; i < 8; i++, x++)
        {
            float x0 = y[i*18];
            float x1 = y[(15 - i)*18];
            float x2 = y[(16 + i)*18];
            float x3 = y[(31 - i)*18];
            float t0 = x0 + x3;
            float t1 = x1 + x2;
            float t2 = (x1 - x2)*g_sec[3*i + 0];
            float t3 = (x0 - x3)*g_sec[3*i + 1];
            x[0] = t0 + t1;
            x[8] = (t0 - t1)*g_sec[3*i + 2];
            x[16] = t3 + t2;
            x[24] = (t3 - t2)*g_sec[3*i + 2];
        }
        for (x = t[0], i = 0; i < 4; i++, x += 8)
        {
            float x0 = x[0], x1 = x[1], x2 = x[2], x3 = x[3], x4 = x[4], x5 = x[5], x6 = x[6], x7 = x[7], xt;
            xt = x0 - x7; x0 += x7;
            x7 = x1 - x6; x1 += x6;
            x6 = x2 - x5; x2 += x5;
            x5 = x3 - x4; x3 += x4;
            x4 = x0 - x3; x0 += x3;
            x3 = x1 - x2; x1 += x2;
            x[0] = x0 + x1;
            x[4] = (x0 - x1)*0.70710677f;
            x5 =  x5 + x6;
            x6 = (x6 + x7)*0.70710677f;
            x7 =  x7 + xt;
            x3 = (x3 + x4)*0.70710677f;
            x5 -= x7*0.198912367f;
            x7 += x5*0.382683432f;
            x5 -= x7*0.198912367f;
            x0 = xt - x6; xt += x6;
            x[1] = (xt + x7)*0.50979561f;
            x[2] = (x4 + x3)*0.54119611f;
            x[3] = (x0 - x5)*0.60134488f;
            x[5] = (x0 + x5)*0.89997619f;
            x[6] = (x4 - x3)*1.30656302f;
            x[7] = (xt - x7)*2.56291556f;
        }
        for (i = 0; i < 7; i++, y += 4*18)
        {
            y[0*18] = t[0][i];
            y[1*18] = t[2][i] + t[3][i] + t[3][i + 1];
            y[2*18] = t[1][i] + t[1][i + 1];
            y[3*18] = t[2][i + 1] + t[3][i] + t[3][i + 1];
        }
        y[0*18] = t[0][7];
        y[1*18] = t[2][7] + t[3][7];
        y[2*18] = t[1][7];
        y[3*18] = t[3][7];
    }
#endif
}